

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O1

int ngp_read_line_buffered(FILE *fp)

{
  undefined8 uVar1;
  int iVar2;
  
  if (ngp_curline.line != (char *)0x0) {
    free(ngp_curline.line);
    ngp_curline.value._0_4_ = 0;
    ngp_curline.value._4_4_ = 0;
    ngp_curline.type = 0;
    ngp_curline.line = (char *)0x0;
    ngp_curline.name._0_4_ = 0;
    ngp_curline.name._4_4_ = 0;
    ngp_curline.comment = (char *)0x0;
    ngp_curline.format = 0;
    ngp_curline.flags = 0;
  }
  uVar1 = ngp_prevline._40_8_;
  if (ngp_prevline.line != (char *)0x0) {
    ngp_curline.comment = ngp_prevline.comment;
    ngp_curline.value._0_4_ = ngp_prevline.value._0_4_;
    ngp_curline.value._4_4_ = ngp_prevline.value._4_4_;
    ngp_curline.type = ngp_prevline.type;
    ngp_curline._28_4_ = ngp_prevline._28_4_;
    ngp_curline.line = ngp_prevline.line;
    ngp_curline.name._0_4_ = ngp_prevline.name._0_4_;
    ngp_curline.name._4_4_ = ngp_prevline.name._4_4_;
    ngp_prevline.line = (char *)0x0;
    ngp_prevline.name._0_4_ = 0;
    ngp_prevline.name._4_4_ = 0;
    ngp_prevline.value._0_4_ = 0;
    ngp_prevline.value._4_4_ = 0;
    ngp_prevline.type = 0;
    ngp_prevline.comment = (char *)0x0;
    ngp_prevline.format = 0;
    ngp_prevline.flags = 0;
    ngp_curline.format = (int)uVar1;
    ngp_curline.flags = 1;
    return 0;
  }
  ngp_curline._40_8_ = ngp_curline._40_8_ & 0xffffffff;
  iVar2 = ngp_line_from_file(fp,&ngp_curline.line);
  return iVar2;
}

Assistant:

int	ngp_read_line_buffered(FILE *fp)
 {
   ngp_free_line();				/* first free current line (if any) */
   
   if (NULL != ngp_prevline.line)		/* if cached, return cached line */
     { ngp_curline = ngp_prevline;
       ngp_prevline.line = NULL;
       ngp_prevline.name = NULL;
       ngp_prevline.value = NULL;
       ngp_prevline.comment = NULL;
       ngp_prevline.type = NGP_TTYPE_UNKNOWN;
       ngp_prevline.format = NGP_FORMAT_OK;
       ngp_prevline.flags = 0;
       ngp_curline.flags = NGP_LINE_REREAD;
       return(NGP_OK);
     }

   ngp_curline.flags = 0;   			/* if not cached really read line from file */
   return(ngp_line_from_file(fp, &(ngp_curline.line)));
 }